

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O0

void __thiscall MC::MC_Driver::error(MC_Driver *this,string *message)

{
  ostream *poVar1;
  string *message_local;
  MC_Driver *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
MC::MC_Driver::error(const std::string &message){
    std::cout << "ERROR: "<< message << std::endl;
}